

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.cpp
# Opt level: O1

bool common_params_parse(int argc,char **argv,common_params *params,llama_example ex,
                        _func_void_int_char_ptr_ptr *print_usage)

{
  cpu_params *cpuparams;
  pointer *pplVar1;
  pointer *pplVar2;
  pointer ppcVar3;
  _func_void_common_params_ptr_int *p_Var4;
  mapped_type __x;
  string *psVar5;
  iterator __position;
  iterator __position_00;
  undefined8 uVar6;
  common_params *pcVar7;
  bool bVar8;
  int iVar9;
  int iVar10;
  mapped_type *ppcVar11;
  int *piVar12;
  long lVar13;
  iterator iVar14;
  char *pcVar15;
  runtime_error *this;
  invalid_argument *piVar16;
  char *pcVar17;
  pointer pcVar18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *antiprompt;
  common_arg *pcVar19;
  string *psVar20;
  char **arg_1;
  pointer ppcVar21;
  char **ppcVar22;
  common_arg *opt;
  pointer pcVar23;
  string val2;
  string arg_prefix_1;
  string value;
  common_params_context ctx_arg;
  string val;
  string arg_prefix;
  string arg;
  string arg_2;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_arg_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_arg_*>_>_>
  arg_to_options;
  common_params params_org;
  allocator<char> local_16c1;
  string local_16c0;
  char **local_16a0;
  common_arg *local_1698;
  undefined1 local_1690 [24];
  undefined1 local_1678 [16];
  _Alloc_hider local_1668;
  undefined1 local_1660;
  undefined7 uStack_165f;
  undefined1 local_1658 [16];
  _Alloc_hider local_1648;
  undefined1 local_1640;
  undefined7 uStack_163f;
  undefined1 local_1638 [16];
  _Alloc_hider local_1628;
  undefined1 local_1620;
  undefined7 uStack_161f;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1618;
  undefined1 local_1608 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_15f0;
  _Alloc_hider local_15e0;
  undefined1 local_15d8 [24];
  _Alloc_hider local_15c0;
  undefined1 local_15b0 [16];
  _Alloc_hider local_15a0;
  _Base_ptr local_1598;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1590;
  char *local_1580;
  long *local_1578 [2];
  long local_1568 [2];
  undefined8 local_1558;
  _func_void_common_params_ptr *p_Stack_1550;
  _func_void_common_params_ptr_string_ptr *local_1548;
  _func_void_common_params_ptr_string_ptr_string_ptr *p_Stack_1540;
  _func_void_common_params_ptr_int *local_1538;
  common_params_context local_1530;
  undefined1 local_1500 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_14e8;
  _Alloc_hider local_14d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_14c8;
  _Alloc_hider local_14b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_14a8;
  _Alloc_hider local_1498;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1488;
  undefined2 *local_1478;
  undefined8 local_1470;
  undefined2 local_1468;
  undefined1 uStack_1466;
  undefined5 uStack_1465;
  undefined1 *local_1458;
  undefined8 local_1450;
  undefined1 local_1448;
  undefined7 uStack_1447;
  undefined1 local_1438 [16];
  undefined1 local_1428 [24];
  _Alloc_hider local_1410;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1400;
  _Alloc_hider local_13f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_13e0;
  _Alloc_hider local_13d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_13c0;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_arg_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_arg_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_13b0;
  common_params local_1378;
  
  local_16a0 = argv;
  common_params_parser_init(&local_1530,params,ex,print_usage);
  common_params::common_params(&local_1378,local_1530.params);
  pcVar7 = local_1530.params;
  local_1458 = &local_1448;
  local_1450 = 0;
  local_1448 = 0;
  local_1478 = &local_1468;
  local_1468 = 0x2d2d;
  local_1470 = 2;
  uStack_1466 = 0;
  local_13b0._M_buckets = &local_13b0._M_single_bucket;
  local_13b0._M_bucket_count = 1;
  local_13b0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_13b0._M_element_count = 0;
  local_13b0._M_rehash_policy._M_max_load_factor = 1.0;
  local_13b0._M_rehash_policy._M_next_resize = 0;
  local_13b0._M_single_bucket = (__node_base_ptr)0x0;
  local_1698 = local_1530.options.super__Vector_base<common_arg,_std::allocator<common_arg>_>.
               _M_impl.super__Vector_impl_data._M_finish;
  ppcVar22 = local_16a0;
  pcVar19 = local_1530.options.super__Vector_base<common_arg,_std::allocator<common_arg>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (local_1530.options.super__Vector_base<common_arg,_std::allocator<common_arg>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_1530.options.super__Vector_base<common_arg,_std::allocator<common_arg>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pcVar23 = local_1530.options.super__Vector_base<common_arg,_std::allocator<common_arg>_>._M_impl
              .super__Vector_impl_data._M_start;
    do {
      ppcVar3 = (pcVar23->args).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      for (ppcVar21 = (pcVar23->args).
                      super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                      super__Vector_impl_data._M_start; ppcVar21 != ppcVar3; ppcVar21 = ppcVar21 + 1
          ) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_1608,*ppcVar21,(allocator<char> *)local_1690);
        ppcVar11 = std::__detail::
                   _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_arg_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_arg_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_arg_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_arg_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                 *)&local_13b0,(key_type *)local_1608);
        *ppcVar11 = pcVar23;
        if ((undefined1 *)local_1608._0_8_ != local_1608 + 0x10) {
          operator_delete((void *)local_1608._0_8_,CONCAT71(local_1608._17_7_,local_1608[0x10]) + 1)
          ;
        }
      }
      pcVar23 = pcVar23 + 1;
      ppcVar22 = local_16a0;
      pcVar19 = local_1530.options.super__Vector_base<common_arg,_std::allocator<common_arg>_>.
                _M_impl.super__Vector_impl_data._M_start;
    } while (pcVar23 != local_1698);
  }
  for (; pcVar19 !=
         local_1530.options.super__Vector_base<common_arg,_std::allocator<common_arg>_>._M_impl.
         super__Vector_impl_data._M_finish; pcVar19 = pcVar19 + 1) {
    local_1608._0_8_ = local_1608 + 0x10;
    local_1608._8_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    local_1608[0x10] = '\0';
    bVar8 = common_arg::get_value_from_env(pcVar19,(string *)local_1608);
    if (bVar8) {
      if ((pcVar19->handler_void != (_func_void_common_params_ptr *)0x0) &&
         ((iVar9 = std::__cxx11::string::compare(local_1608), iVar9 == 0 ||
          (iVar9 = std::__cxx11::string::compare(local_1608), iVar9 == 0)))) {
        (*pcVar19->handler_void)(pcVar7);
      }
      uVar6 = local_1608._0_8_;
      p_Var4 = pcVar19->handler_int;
      if (p_Var4 != (_func_void_common_params_ptr_int *)0x0) {
        piVar12 = __errno_location();
        iVar9 = *piVar12;
        *piVar12 = 0;
        lVar13 = strtol((char *)uVar6,(char **)local_1690,10);
        if (local_1690._0_8_ != uVar6) {
          if ((0xfffffffeffffffff < lVar13 - 0x80000000U) && (*piVar12 != 0x22)) {
            if (*piVar12 == 0) {
              *piVar12 = iVar9;
            }
            (*p_Var4)(pcVar7,(int)lVar13);
            ppcVar22 = local_16a0;
            goto LAB_0012a4dd;
          }
          std::__throw_out_of_range("stoi");
        }
        std::__throw_invalid_argument("stoi");
        goto LAB_0012b15d;
      }
LAB_0012a4dd:
      if (pcVar19->handler_string != (_func_void_common_params_ptr_string_ptr *)0x0) {
        (*pcVar19->handler_string)(pcVar7,(string *)local_1608);
      }
    }
    if ((undefined1 *)local_1608._0_8_ != local_1608 + 0x10) {
      operator_delete((void *)local_1608._0_8_,CONCAT71(local_1608._17_7_,local_1608[0x10]) + 1);
    }
  }
  if (1 < argc) {
    iVar9 = 1;
    do {
      local_1690._0_8_ = local_1690 + 0x10;
      local_1690._8_8_ = (string *)0x2;
      local_1690._16_3_ = 0x2d2d;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1438,ppcVar22[iVar9],(allocator<char> *)local_1608);
      iVar10 = std::__cxx11::string::compare((ulong)local_1438,0,(string *)local_1690._8_8_);
      if ((iVar10 == 0) && ((pointer)local_1438._8_8_ != (pointer)0x0)) {
        pcVar18 = (pointer)0x0;
        do {
          if (*(string *)(local_1438._0_8_ + (long)pcVar18) == (string)0x5f) {
            *(string *)(local_1438._0_8_ + (long)pcVar18) = (string)0x2d;
          }
          pcVar18 = pcVar18 + 1;
        } while ((pointer)local_1438._8_8_ != pcVar18);
      }
      iVar14 = std::
               _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_arg_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_arg_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               ::find(&local_13b0,(key_type *)local_1438);
      if (iVar14.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_arg_*>,_true>
          ._M_cur == (__node_type *)0x0) {
        piVar16 = (invalid_argument *)__cxa_allocate_exception(0x10);
        string_format_abi_cxx11_
                  ((string *)local_1608,"error: invalid argument: %s",local_1438._0_8_);
        std::invalid_argument::invalid_argument(piVar16,(string *)local_1608);
        __cxa_throw(piVar16,&std::invalid_argument::typeinfo,
                    std::invalid_argument::~invalid_argument);
      }
      ppcVar11 = std::__detail::
                 _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_arg_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_arg_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_arg_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_arg_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)&local_13b0,(key_type *)local_1438);
      __x = *ppcVar11;
      std::
      _Rb_tree<llama_example,_llama_example,_std::_Identity<llama_example>,_std::less<llama_example>,_std::allocator<llama_example>_>
      ::_Rb_tree((_Rb_tree<llama_example,_llama_example,_std::_Identity<llama_example>,_std::less<llama_example>,_std::allocator<llama_example>_>
                  *)local_1608,
                 (_Rb_tree<llama_example,_llama_example,_std::_Identity<llama_example>,_std::less<llama_example>,_std::allocator<llama_example>_>
                  *)__x);
      std::
      _Rb_tree<llama_example,_llama_example,_std::_Identity<llama_example>,_std::less<llama_example>,_std::allocator<llama_example>_>
      ::_Rb_tree((_Rb_tree<llama_example,_llama_example,_std::_Identity<llama_example>,_std::less<llama_example>,_std::allocator<llama_example>_>
                  *)local_15d8,&(__x->excludes)._M_t);
      std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
                ((vector<const_char_*,_std::allocator<const_char_*>_> *)(local_15b0 + 8),&__x->args)
      ;
      local_1580 = __x->env;
      local_1590._M_allocated_capacity._0_4_ = *(undefined4 *)&__x->value_hint;
      local_1590._M_allocated_capacity._4_4_ = *(undefined4 *)((long)&__x->value_hint + 4);
      local_1590._8_4_ = *(undefined4 *)&__x->value_hint_2;
      local_1590._12_4_ = *(undefined4 *)((long)&__x->value_hint_2 + 4);
      local_1578[0] = local_1568;
      pcVar18 = (__x->help)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_1578,pcVar18,pcVar18 + (__x->help)._M_string_length);
      pcVar17 = local_1580;
      local_1538 = __x->handler_int;
      local_1558 = *(undefined8 *)&__x->is_sparam;
      p_Stack_1550 = __x->handler_void;
      local_1548 = __x->handler_string;
      p_Stack_1540 = __x->handler_str_str;
      if ((local_1580 != (char *)0x0) && (pcVar15 = getenv(local_1580), pcVar15 != (char *)0x0)) {
        fprintf(_stderr,
                "warn: %s environment variable is set, but will be overwritten by command line argument %s\n"
                ,pcVar17,local_1438._0_8_);
      }
      if (p_Stack_1550 == (_func_void_common_params_ptr *)0x0) {
        iVar10 = iVar9 + 1;
        if (argc <= iVar10) {
LAB_0012b15d:
          piVar16 = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::invalid_argument::invalid_argument(piVar16,"expected value for argument");
          __cxa_throw(piVar16,&std::invalid_argument::typeinfo,
                      std::invalid_argument::~invalid_argument);
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_1500,ppcVar22[iVar10],(allocator<char> *)&local_16c0);
        uVar6 = local_1500._0_8_;
        p_Var4 = local_1538;
        if (local_1538 != (_func_void_common_params_ptr_int *)0x0) {
          piVar12 = __errno_location();
          iVar9 = *piVar12;
          *piVar12 = 0;
          lVar13 = strtol((char *)uVar6,(char **)&local_16c0,10);
          if (local_16c0._M_dataplus._M_p != (pointer)uVar6) {
            if ((0xfffffffeffffffff < lVar13 - 0x80000000U) && (*piVar12 != 0x22)) {
              if (*piVar12 == 0) {
                *piVar12 = iVar9;
              }
              (*p_Var4)(pcVar7,(int)lVar13);
              ppcVar22 = local_16a0;
              iVar9 = iVar10;
              goto LAB_0012a80e;
            }
            std::__throw_out_of_range("stoi");
          }
          std::__throw_invalid_argument("stoi");
          goto LAB_0012b1a7;
        }
        if (local_1548 == (_func_void_common_params_ptr_string_ptr *)0x0) {
          iVar9 = iVar9 + 2;
          if (argc <= iVar9) {
            piVar16 = (invalid_argument *)__cxa_allocate_exception(0x10);
            std::invalid_argument::invalid_argument(piVar16,"expected value for argument");
            __cxa_throw(piVar16,&std::invalid_argument::typeinfo,
                        std::invalid_argument::~invalid_argument);
          }
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_16c0,ppcVar22[iVar9],&local_16c1);
          if (p_Stack_1540 != (_func_void_common_params_ptr_string_ptr_string_ptr *)0x0) {
            (*p_Stack_1540)(pcVar7,(string *)local_1500,&local_16c0);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_16c0._M_dataplus._M_p != &local_16c0.field_2) {
            operator_delete(local_16c0._M_dataplus._M_p,
                            CONCAT71(local_16c0.field_2._M_allocated_capacity._1_7_,
                                     local_16c0.field_2._M_local_buf[0]) + 1);
          }
        }
        else {
          (*local_1548)(pcVar7,(string *)local_1500);
          iVar9 = iVar10;
        }
LAB_0012a80e:
        if ((undefined1 *)local_1500._0_8_ != local_1500 + 0x10) {
          operator_delete((void *)local_1500._0_8_,CONCAT71(local_1500._17_7_,local_1500[0x10]) + 1)
          ;
        }
      }
      else {
        (*p_Stack_1550)(pcVar7);
      }
      if (local_1578[0] != local_1568) {
        operator_delete(local_1578[0],local_1568[0] + 1);
      }
      if ((void *)local_15b0._8_8_ != (void *)0x0) {
        operator_delete((void *)local_15b0._8_8_,(long)local_1598 - local_15b0._8_8_);
      }
      std::
      _Rb_tree<llama_example,_llama_example,_std::_Identity<llama_example>,_std::less<llama_example>,_std::allocator<llama_example>_>
      ::~_Rb_tree((_Rb_tree<llama_example,_llama_example,_std::_Identity<llama_example>,_std::less<llama_example>,_std::allocator<llama_example>_>
                   *)local_15d8);
      std::
      _Rb_tree<llama_example,_llama_example,_std::_Identity<llama_example>,_std::less<llama_example>,_std::allocator<llama_example>_>
      ::~_Rb_tree((_Rb_tree<llama_example,_llama_example,_std::_Identity<llama_example>,_std::less<llama_example>,_std::allocator<llama_example>_>
                   *)local_1608);
      if ((string *)local_1438._0_8_ != (string *)local_1428) {
        operator_delete((void *)local_1438._0_8_,CONCAT71(local_1428._1_7_,local_1428[0]) + 1);
      }
      if ((undefined1 *)local_1690._0_8_ != local_1690 + 0x10) {
        operator_delete((void *)local_1690._0_8_,(ulong)(local_1690._16_8_ + 1));
      }
      iVar9 = iVar9 + 1;
    } while (iVar9 < argc);
  }
  cpuparams = &pcVar7->cpuparams;
  postprocess_cpu_params(cpuparams,(cpu_params *)0x0);
  postprocess_cpu_params(&pcVar7->cpuparams_batch,cpuparams);
  postprocess_cpu_params(&(pcVar7->speculative).cpuparams,cpuparams);
  postprocess_cpu_params(&(pcVar7->speculative).cpuparams_batch,&pcVar7->cpuparams_batch);
  if ((pcVar7->prompt_cache_all == true) &&
     ((pcVar7->interactive != false || (pcVar7->interactive_first == true)))) {
LAB_0012b1a7:
    piVar16 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (piVar16,"error: --prompt-cache-all not supported in interactive mode yet\n");
  }
  else {
    pcVar17 = local_1690 + 0x10;
    local_1438._0_8_ = (string *)0x1d;
    local_1690._0_8_ = pcVar17;
    local_1690._0_8_ = std::__cxx11::string::_M_create((ulong *)local_1690,(ulong)local_1438);
    pcVar19 = (common_arg *)&pcVar7->hf_token;
    local_1690._16_8_ = local_1438._0_8_;
    builtin_strncpy((char *)local_1690._0_8_,"models/7B/ggml-model-f16.gguf",0x1d);
    local_1690._8_8_ = local_1438._0_8_;
    *(char *)(local_1690._0_8_ + local_1438._0_8_) = '\0';
    common_params_handle_model
              ((handle_model_result *)local_1608,&pcVar7->model,(string *)pcVar19,
               (string *)local_1690);
    if ((char *)local_1690._0_8_ != pcVar17) {
      operator_delete((void *)local_1690._0_8_,(ulong)(local_1690._16_8_ + 1));
    }
    if (pcVar7->no_mmproj == true) {
      local_1690._8_8_ = (string *)0x0;
      local_1690._16_8_ = local_1690._16_8_ & 0xffffffffffffff00;
      local_1668._M_p = (pointer)0x0;
      local_1660 = 0;
      local_1648._M_p = (pointer)0x0;
      local_1640 = 0;
      local_1628._M_p = (pointer)0x0;
      local_1620 = 0;
      local_1698 = pcVar19;
      local_1690._0_8_ = pcVar17;
      local_1678._8_8_ = &local_1660;
      local_1658._8_8_ = &local_1640;
      local_1638._8_8_ = &local_1620;
      std::__cxx11::string::operator=((string *)&pcVar7->mmproj,(string *)local_1690);
      std::__cxx11::string::operator=((string *)&(pcVar7->mmproj).url,(string *)(local_1678 + 8));
      std::__cxx11::string::operator=
                ((string *)&(pcVar7->mmproj).hf_repo,(string *)(local_1658 + 8));
      std::__cxx11::string::operator=
                ((string *)&(pcVar7->mmproj).hf_file,(string *)(local_1638 + 8));
      if ((undefined1 *)local_1638._8_8_ != &local_1620) {
        operator_delete((void *)local_1638._8_8_,CONCAT71(uStack_161f,local_1620) + 1);
      }
      if ((undefined1 *)local_1658._8_8_ != &local_1640) {
        operator_delete((void *)local_1658._8_8_,CONCAT71(uStack_163f,local_1640) + 1);
      }
      pcVar19 = local_1698;
      if ((undefined1 *)local_1678._8_8_ != &local_1660) {
        operator_delete((void *)local_1678._8_8_,CONCAT71(uStack_165f,local_1660) + 1);
      }
      if ((undefined1 *)local_1690._0_8_ != local_1690 + 0x10) {
        operator_delete((void *)local_1690._0_8_,(ulong)(local_1690._16_8_ + 1));
      }
    }
    else if (((local_1608[0] == (allocator<char>)0x1) &&
             ((pcVar7->mmproj).path._M_string_length == 0)) &&
            ((pcVar7->mmproj).url._M_string_length == 0)) {
      std::__cxx11::string::_M_assign((string *)&pcVar7->mmproj);
      std::__cxx11::string::_M_assign((string *)&(pcVar7->mmproj).url);
      std::__cxx11::string::_M_assign((string *)&(pcVar7->mmproj).hf_repo);
      std::__cxx11::string::_M_assign((string *)&(pcVar7->mmproj).hf_file);
    }
    if (mmproj_examples._M_len != 0) {
      lVar13 = 0;
      do {
        if (local_1530.ex == *(llama_example *)((long)mmproj_examples._M_array + lVar13)) {
          local_1438._8_8_ = (pointer)0x0;
          local_1428[0] = '\0';
          local_1438._0_8_ = (string *)local_1428;
          common_params_handle_model
                    ((handle_model_result *)local_1690,&pcVar7->mmproj,(string *)pcVar19,
                     (string *)local_1438);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1628._M_p != &local_1618) {
            operator_delete(local_1628._M_p,local_1618._M_allocated_capacity + 1);
          }
          if (local_1648._M_p != local_1638) {
            operator_delete(local_1648._M_p,local_1638._0_8_ + 1);
          }
          if (local_1668._M_p != local_1658) {
            operator_delete(local_1668._M_p,local_1658._0_8_ + 1);
          }
          if ((string *)local_1690._8_8_ != (string *)local_1678) {
            operator_delete((void *)local_1690._8_8_,local_1678._0_8_ + 1);
          }
          if ((string *)local_1438._0_8_ != (string *)local_1428) {
            operator_delete((void *)local_1438._0_8_,CONCAT71(local_1428._1_7_,local_1428[0]) + 1);
          }
          break;
        }
        lVar13 = lVar13 + 4;
      } while (mmproj_examples._M_len << 2 != lVar13);
    }
    local_1500._8_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    local_1500[0x10] = '\0';
    local_1500._0_8_ = local_1500 + 0x10;
    common_params_handle_model
              ((handle_model_result *)local_1438,&(pcVar7->speculative).model,(string *)pcVar19,
               (string *)local_1500);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_13d0._M_p != &local_13c0) {
      operator_delete(local_13d0._M_p,local_13c0._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_13f0._M_p != &local_13e0) {
      operator_delete(local_13f0._M_p,local_13e0._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1410._M_p != &local_1400) {
      operator_delete(local_1410._M_p,local_1400._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_1438._8_8_ != local_1428 + 8) {
      operator_delete((void *)local_1438._8_8_,local_1428._8_8_ + 1);
    }
    if ((undefined1 *)local_1500._0_8_ != local_1500 + 0x10) {
      operator_delete((void *)local_1500._0_8_,CONCAT71(local_1500._17_7_,local_1500[0x10]) + 1);
    }
    local_16c0._M_string_length = 0;
    local_16c0.field_2._M_local_buf[0] = '\0';
    local_16c0._M_dataplus._M_p = (pointer)&local_16c0.field_2;
    common_params_handle_model
              ((handle_model_result *)local_1500,&(pcVar7->vocoder).model,(string *)pcVar19,
               &local_16c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1498._M_p != &local_1488) {
      operator_delete(local_1498._M_p,local_1488._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_14b8._M_p != &local_14a8) {
      operator_delete(local_14b8._M_p,local_14a8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_14d8._M_p != &local_14c8) {
      operator_delete(local_14d8._M_p,local_14c8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1500._8_8_ != &local_14e8) {
      operator_delete((void *)local_1500._8_8_,local_14e8._0_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_16c0._M_dataplus._M_p != &local_16c0.field_2) {
      operator_delete(local_16c0._M_dataplus._M_p,
                      CONCAT71(local_16c0.field_2._M_allocated_capacity._1_7_,
                               local_16c0.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_15a0._M_p != &local_1590) {
      operator_delete(local_15a0._M_p,
                      CONCAT44(local_1590._M_allocated_capacity._4_4_,
                               local_1590._M_allocated_capacity._0_4_) + 1);
    }
    if ((_Base_ptr)local_15c0._M_p != (_Base_ptr)local_15b0) {
      operator_delete(local_15c0._M_p,local_15b0._0_8_ + 1);
    }
    if (local_15e0._M_p != local_15d8 + 8) {
      operator_delete(local_15e0._M_p,local_15d8._8_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1608._8_8_ != &local_15f0) {
      operator_delete((void *)local_1608._8_8_,local_15f0._0_8_ + 1);
    }
    if (pcVar7->escape == true) {
      string_process_escapes(&pcVar7->prompt);
      string_process_escapes(&pcVar7->input_prefix);
      string_process_escapes(&pcVar7->input_suffix);
      psVar5 = (pcVar7->antiprompt).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (psVar20 = (pcVar7->antiprompt).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; psVar20 != psVar5;
          psVar20 = psVar20 + 1) {
        string_process_escapes(psVar20);
      }
      psVar5 = (pcVar7->sampling).dry_sequence_breakers.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (psVar20 = (pcVar7->sampling).dry_sequence_breakers.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; psVar20 != psVar5;
          psVar20 = psVar20 + 1) {
        string_process_escapes(psVar20);
      }
    }
    __position._M_current =
         (pcVar7->kv_overrides).
         super__Vector_base<llama_model_kv_override,_std::allocator<llama_model_kv_override>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if ((pcVar7->kv_overrides).
        super__Vector_base<llama_model_kv_override,_std::allocator<llama_model_kv_override>_>.
        _M_impl.super__Vector_impl_data._M_start != __position._M_current) {
      if (__position._M_current ==
          (pcVar7->kv_overrides).
          super__Vector_base<llama_model_kv_override,_std::allocator<llama_model_kv_override>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<llama_model_kv_override,_std::allocator<llama_model_kv_override>_>::
        _M_realloc_insert<>(&pcVar7->kv_overrides,__position);
      }
      else {
        memset(__position._M_current,0,0x108);
        pplVar1 = &(pcVar7->kv_overrides).
                   super__Vector_base<llama_model_kv_override,_std::allocator<llama_model_kv_override>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *pplVar1 = *pplVar1 + 1;
      }
      (pcVar7->kv_overrides).
      super__Vector_base<llama_model_kv_override,_std::allocator<llama_model_kv_override>_>._M_impl.
      super__Vector_impl_data._M_finish[-1].key[0] = '\0';
    }
    __position_00._M_current =
         (pcVar7->tensor_buft_overrides).
         super__Vector_base<llama_model_tensor_buft_override,_std::allocator<llama_model_tensor_buft_override>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if ((pcVar7->tensor_buft_overrides).
        super__Vector_base<llama_model_tensor_buft_override,_std::allocator<llama_model_tensor_buft_override>_>
        ._M_impl.super__Vector_impl_data._M_start != __position_00._M_current) {
      local_1608._0_8_ = (char *)0x0;
      local_1608._8_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      if (__position_00._M_current ==
          (pcVar7->tensor_buft_overrides).
          super__Vector_base<llama_model_tensor_buft_override,_std::allocator<llama_model_tensor_buft_override>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<llama_model_tensor_buft_override,_std::allocator<llama_model_tensor_buft_override>_>
        ::_M_realloc_insert<llama_model_tensor_buft_override>
                  (&pcVar7->tensor_buft_overrides,__position_00,
                   (llama_model_tensor_buft_override *)local_1608);
      }
      else {
        (__position_00._M_current)->pattern = (char *)0x0;
        (__position_00._M_current)->buft = (ggml_backend_buffer_type_t)0x0;
        pplVar2 = &(pcVar7->tensor_buft_overrides).
                   super__Vector_base<llama_model_tensor_buft_override,_std::allocator<llama_model_tensor_buft_override>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *pplVar2 = *pplVar2 + 1;
      }
    }
    if ((pcVar7->reranking != true) || (pcVar7->embedding != true)) {
      if (((pcVar7->chat_template)._M_string_length != 0) &&
         (bVar8 = common_chat_verify_template(&pcVar7->chat_template,pcVar7->use_jinja), !bVar8)) {
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        pcVar17 = 
        "\nnote: llama.cpp was started without --jinja, we only support commonly used templates";
        if (pcVar7->use_jinja != false) {
          pcVar17 = "";
        }
        string_format_abi_cxx11_
                  ((string *)local_1608,"error: the supplied chat template is not supported: %s%s\n"
                   ,(pcVar7->chat_template)._M_dataplus._M_p,pcVar17);
        std::runtime_error::runtime_error(this,(string *)local_1608);
        __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_arg_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_arg_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(&local_13b0);
      if (local_1478 != &local_1468) {
        operator_delete(local_1478,CONCAT53(uStack_1465,CONCAT12(uStack_1466,local_1468)) + 1);
      }
      if (local_1458 != &local_1448) {
        operator_delete(local_1458,CONCAT71(uStack_1447,local_1448) + 1);
      }
      if ((local_1530.params)->usage == false) {
        if ((local_1530.params)->completion != true) {
          common_params::~common_params(&local_1378);
          std::vector<common_arg,_std::allocator<common_arg>_>::~vector(&local_1530.options);
          return true;
        }
        common_params_print_completion(&local_1530);
      }
      else {
        common_params_print_usage(&local_1530);
        if (local_1530.print_usage != (_func_void_int_char_ptr_ptr *)0x0) {
          (*local_1530.print_usage)(argc,local_16a0);
        }
      }
      exit(0);
    }
    piVar16 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (piVar16,"error: either --embedding or --reranking can be specified, but not both");
  }
  __cxa_throw(piVar16,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

bool common_params_parse(int argc, char ** argv, common_params & params, llama_example ex, void(*print_usage)(int, char **)) {
    auto ctx_arg = common_params_parser_init(params, ex, print_usage);
    const common_params params_org = ctx_arg.params; // the example can modify the default params

    try {
        if (!common_params_parse_ex(argc, argv, ctx_arg)) {
            ctx_arg.params = params_org;
            return false;
        }
        if (ctx_arg.params.usage) {
            common_params_print_usage(ctx_arg);
            if (ctx_arg.print_usage) {
                ctx_arg.print_usage(argc, argv);
            }
            exit(0);
        }
        if (ctx_arg.params.completion) {
            common_params_print_completion(ctx_arg);
            exit(0);
        }
    } catch (const std::invalid_argument & ex) {
        fprintf(stderr, "%s\n", ex.what());
        ctx_arg.params = params_org;
        return false;
    }

    return true;
}